

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlDebugDumpDocument(FILE *output,xmlDocPtr doc)

{
  xmlDebugCtxt ctxt;
  xmlDebugCtxt local_b8;
  
  if (output == (FILE *)0x0) {
    output = _stdout;
  }
  xmlCtxtDumpInitCtxt(&local_b8);
  local_b8.options._0_1_ = (byte)local_b8.options | 1;
  local_b8.output = output;
  xmlCtxtDumpDocument(&local_b8,doc);
  return;
}

Assistant:

void
xmlDebugDumpDocument(FILE * output, xmlDocPtr doc)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.options |= DUMP_TEXT_TYPE;
    ctxt.output = output;
    xmlCtxtDumpDocument(&ctxt, doc);
    xmlCtxtDumpCleanCtxt(&ctxt);
}